

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_>::rehash
          (Data<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_> *this,
          size_t sizeHint)

{
  DeduplicationKey *key;
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  char *pcVar6;
  qsizetype qVar7;
  Chain *pCVar8;
  ulong uVar9;
  QHashMultiReturnType<RCCResourceLibrary::CompressionAlgorithm,_int,_int,_QByteArray> hash;
  MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*> *pMVar10;
  ulong uVar11;
  size_t index;
  long lVar12;
  Span *pSVar13;
  size_t numBuckets;
  uchar *args_3;
  long lVar14;
  R RVar15;
  Bucket BVar16;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar15 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar11 = 0;
    pSVar13 = pSVar3;
    do {
      lVar12 = 0;
      do {
        if (pSVar13->offsets[lVar12] != 0xff) {
          pEVar4 = pSVar3[uVar11].entries;
          uVar9 = (ulong)((uint)pSVar13->offsets[lVar12] * 0x30);
          key = (DeduplicationKey *)((pEVar4->storage).data + uVar9);
          puVar1 = (pEVar4->storage).data + uVar9;
          args_3 = puVar1 + 0x10;
          hash = qHashMulti<RCCResourceLibrary::CompressionAlgorithm,int,int,QByteArray>
                           (this->seed,(CompressionAlgorithm *)key,
                            (int *)((pEVar4->storage).data + uVar9 + 4),
                            (int *)((pEVar4->storage).data + uVar9 + 8),(QByteArray *)args_3);
          BVar16 = findBucketWithHash<RCCFileInfo::DeduplicationKey>(this,key,hash);
          pMVar10 = Span<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_>::
                    insert(BVar16.span,BVar16.index);
          uVar5 = *(undefined8 *)puVar1;
          (pMVar10->key).compressAlgo = (int)uVar5;
          (pMVar10->key).compressLevel = (int)((ulong)uVar5 >> 0x20);
          (pMVar10->key).compressThreshold = *(int *)(puVar1 + 8);
          args_3[0] = '\0';
          args_3[1] = '\0';
          args_3[2] = '\0';
          args_3[3] = '\0';
          args_3[4] = '\0';
          args_3[5] = '\0';
          args_3[6] = '\0';
          args_3[7] = '\0';
          (pMVar10->key).hash.d.d = *(Data **)args_3;
          pcVar6 = *(char **)(puVar1 + 0x18);
          puVar1[0x18] = '\0';
          puVar1[0x19] = '\0';
          puVar1[0x1a] = '\0';
          puVar1[0x1b] = '\0';
          puVar1[0x1c] = '\0';
          puVar1[0x1d] = '\0';
          puVar1[0x1e] = '\0';
          puVar1[0x1f] = '\0';
          (pMVar10->key).hash.d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(puVar1 + 0x20);
          puVar1[0x20] = '\0';
          puVar1[0x21] = '\0';
          puVar1[0x22] = '\0';
          puVar1[0x23] = '\0';
          puVar1[0x24] = '\0';
          puVar1[0x25] = '\0';
          puVar1[0x26] = '\0';
          puVar1[0x27] = '\0';
          (pMVar10->key).hash.d.size = qVar7;
          pCVar8 = *(Chain **)(puVar1 + 0x28);
          puVar1[0x28] = '\0';
          puVar1[0x29] = '\0';
          puVar1[0x2a] = '\0';
          puVar1[0x2b] = '\0';
          puVar1[0x2c] = '\0';
          puVar1[0x2d] = '\0';
          puVar1[0x2e] = '\0';
          puVar1[0x2f] = '\0';
          pMVar10->value = pCVar8;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_>::freeData
                (pSVar3 + uVar11);
      uVar11 = uVar11 + 1;
      pSVar13 = pSVar13 + 1;
    } while (uVar11 != uVar2 >> 7);
  }
  lVar12 = *(long *)&pSVar3[-1].allocated;
  if (lVar12 != 0) {
    lVar14 = lVar12 * 0x90;
    do {
      Span<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_>::freeData
                ((Span<QHashPrivate::MultiNode<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*>_> *)
                 (pSVar3[-1].offsets + lVar14));
      lVar14 = lVar14 + -0x90;
    } while (lVar14 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar12 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }